

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall tf::TFProfManager::~TFProfManager(TFProfManager *this)

{
  size_type sVar1;
  pointer psVar2;
  size_t i_1;
  long lVar3;
  size_t i;
  ulong uVar4;
  ProfileData data;
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> serializer;
  ofstream ofs;
  byte abStack_210 [480];
  
  std::ofstream::ofstream(&ofs,(string *)this,_S_out);
  if ((abStack_210[*(long *)(_ofs + -0x18)] & 5) == 0) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                      (&this->_fpath,".tfp",0xffffffffffffffff);
    if (sVar1 == 0xffffffffffffffff) {
      std::operator<<((ostream *)&ofs,"[\n");
      lVar3 = 0;
      for (uVar4 = 0;
          psVar2 = (this->_observers).
                   super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar4 < (ulong)((long)(this->_observers).
                                super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
          uVar4 = uVar4 + 1) {
        if (uVar4 != 0) {
          std::operator<<((ostream *)&ofs,',');
          psVar2 = (this->_observers).
                   super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        TFProfObserver::dump
                  (*(TFProfObserver **)
                    ((long)&(psVar2->
                            super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + lVar3),(ostream *)&ofs);
        lVar3 = lVar3 + 0x10;
      }
      std::operator<<((ostream *)&ofs,"]\n");
    }
    else {
      data.timelines.super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data.timelines.super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      data.timelines.super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::reserve
                (&data.timelines,
                 (long)(this->_observers).
                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_observers).
                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      lVar3 = 0;
      for (uVar4 = 0;
          psVar2 = (this->_observers).
                   super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar4 < (ulong)((long)(this->_observers).
                                super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
          uVar4 = uVar4 + 1) {
        std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::emplace_back<tf::Timeline>
                  (&data.timelines,
                   (Timeline *)
                   (*(long *)((long)&(psVar2->
                                     super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar3) + 8));
        lVar3 = lVar3 + 0x10;
      }
      serializer._stream = &ofs;
      Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
      _save<const_std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>_&,_nullptr>
                (&serializer,&data.timelines);
      std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::~vector(&data.timelines);
    }
  }
  std::ofstream::~ofstream(&ofs);
  std::
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ::~vector(&this->_observers);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

inline TFProfManager::~TFProfManager() {
  std::ofstream ofs(_fpath);
  if(ofs) {
    // .tfp
    if(_fpath.rfind(".tfp") != std::string::npos) {
      ProfileData data;
      data.timelines.reserve(_observers.size());
      for(size_t i=0; i<_observers.size(); ++i) {
        data.timelines.push_back(std::move(_observers[i]->_timeline));
      }
      Serializer<std::ofstream> serializer(ofs);
      serializer(data);
    }
    // .json
    else {
      ofs << "[\n";
      for(size_t i=0; i<_observers.size(); ++i) {
        if(i) ofs << ',';
        _observers[i]->dump(ofs);
      }
      ofs << "]\n";
    }
  }
}